

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertproxymodel.cpp
# Opt level: O3

ItemFlags __thiscall InsertProxyModel::flags(InsertProxyModel *this,QModelIndex *index)

{
  int iVar1;
  InsertProxyModelPrivate *pIVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  long *plVar6;
  long *plVar7;
  undefined8 uVar8;
  byte bVar9;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  if (index->r < 0) {
    return (ItemFlags)0;
  }
  if (index->c < 0) {
    return (ItemFlags)0;
  }
  if (index->m == (QAbstractItemModel *)0x0) {
    return (ItemFlags)0;
  }
  lVar5 = QAbstractProxyModel::sourceModel();
  if (lVar5 == 0) {
    return (ItemFlags)0;
  }
  pIVar2 = this->m_dptr;
  iVar1 = index->r;
  plVar6 = (long *)QAbstractProxyModel::sourceModel();
  local_58 = 0xffffffffffffffff;
  local_50 = 0;
  uStack_48 = 0;
  iVar3 = (**(code **)(*plVar6 + 0x78))(plVar6);
  if (iVar1 == iVar3) {
    bVar9 = (byte)(pIVar2->m_insertDirection).i & 1;
  }
  else {
    bVar9 = 0;
  }
  iVar1 = index->c;
  plVar6 = (long *)QAbstractProxyModel::sourceModel();
  local_58 = 0xffffffffffffffff;
  local_50 = 0;
  uStack_48 = 0;
  iVar3 = (**(code **)(*plVar6 + 0x80))(plVar6);
  if (iVar1 == iVar3) {
    uVar4 = (pIVar2->m_insertDirection).i;
    if ((bVar9 & (byte)((uVar4 & 2) >> 1)) != 0) {
      return (ItemFlags)0;
    }
    if (bVar9 != 0) goto LAB_00141d9e;
    if ((uVar4 & 2) == 0) goto LAB_00141db5;
    iVar1 = index->r;
    lVar5 = *(long *)this;
    uVar8 = 0;
  }
  else {
    if (bVar9 == 0) {
LAB_00141db5:
      plVar6 = (long *)QAbstractProxyModel::sourceModel();
      plVar7 = (long *)QAbstractProxyModel::sourceModel();
      local_40 = 0xffffffffffffffff;
      local_38 = 0;
      uStack_30 = 0;
      (**(code **)(*plVar7 + 0x60))(&local_58,plVar7,index->r,index->c);
      uVar4 = (**(code **)(*plVar6 + 0x138))(plVar6,&local_58);
      goto LAB_00141e02;
    }
LAB_00141d9e:
    iVar1 = index->c;
    lVar5 = *(long *)this;
    uVar8 = 1;
  }
  uVar4 = (**(code **)(lVar5 + 0x1d0))(this,uVar8,iVar1);
LAB_00141e02:
  return (ItemFlags)(uVar4 | 0x80);
}

Assistant:

Qt::ItemFlags InsertProxyModel::flags(const QModelIndex &index) const
{
    if (!index.isValid())
        return Qt::NoItemFlags;
    if (!sourceModel())
        return Qt::NoItemFlags;
    Q_D(const InsertProxyModel);
    const bool isExtraRow = index.row() == sourceModel()->rowCount() && d->m_insertDirection & InsertRow;
    const bool isExtraCol = index.column() == sourceModel()->columnCount() && d->m_insertDirection & InsertColumn;
    if (isExtraRow && isExtraCol)
        return Qt::NoItemFlags;
    if (isExtraRow)
        return flagForExtra(true, index.column()) | Qt::ItemNeverHasChildren;
    if (isExtraCol)
        return flagForExtra(false, index.row()) | Qt::ItemNeverHasChildren;
    return sourceModel()->flags(sourceModel()->index(index.row(), index.column())) | Qt::ItemNeverHasChildren;
}